

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O3

Vec_Int_t *
Gia_ManFxTopoOrder(Vec_Wec_t *vCubes,int nInputs,int nStart,Vec_Int_t **pvFirst,Vec_Int_t **pvCount)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  Vec_Int_t *vFirst;
  int *piVar5;
  Vec_Int_t *vCount;
  int *piVar6;
  int **ppiVar7;
  Vec_Int_t *vOrder;
  Vec_Int_t *vVisit;
  size_t __n;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  
  iVar4 = vCubes->nSize;
  lVar11 = (long)iVar4;
  if (lVar11 < 1) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = 0xffffffff;
    lVar10 = 0;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar10) < 1) goto LAB_006b3e26;
      uVar1 = **(uint **)((long)&vCubes->pArray->pArray + lVar10);
      if ((int)uVar9 <= (int)uVar1) {
        uVar9 = uVar1;
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar11 << 4 != lVar10);
  }
  uVar1 = uVar9 + 1;
  if (uVar1 == nStart) {
    vOrder = (Vec_Int_t *)0x0;
  }
  else {
    vFirst = (Vec_Int_t *)malloc(0x10);
    uVar12 = 0x10;
    if (0xe < uVar9) {
      uVar12 = uVar1;
    }
    vFirst->nCap = uVar12;
    uVar8 = (ulong)uVar12;
    if (uVar12 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc(uVar8 * 4);
    }
    vFirst->pArray = piVar5;
    vFirst->nSize = uVar1;
    __n = (ulong)uVar1 << 2;
    piVar6 = (int *)0x0;
    memset(piVar5,0,__n);
    vCount = (Vec_Int_t *)malloc(0x10);
    vCount->nCap = uVar12;
    if (uVar12 != 0) {
      piVar6 = (int *)malloc(uVar8 * 4);
    }
    vCount->pArray = piVar6;
    vCount->nSize = uVar1;
    memset(piVar6,0,__n);
    if (0 < iVar4) {
      ppiVar7 = &vCubes->pArray->pArray;
      lVar10 = 0;
      do {
        if (*(int *)((long)ppiVar7 + -4) < 1) goto LAB_006b3e26;
        uVar2 = **ppiVar7;
        if ((int)uVar2 < nInputs) {
          __assert_fail("iFanin >= nInputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                        ,0x126,
                        "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                       );
        }
        if (((int)uVar2 < 0) || ((int)uVar9 < (int)uVar2)) goto LAB_006b3e26;
        iVar4 = piVar6[uVar2];
        if (iVar4 == 0) {
          piVar5[uVar2] = (int)lVar10;
        }
        piVar6[uVar2] = iVar4 + 1;
        lVar10 = lVar10 + 1;
        ppiVar7 = ppiVar7 + 2;
      } while (lVar11 != lVar10);
    }
    vOrder = (Vec_Int_t *)malloc(0x10);
    iVar4 = 0x10;
    if (0xe < nInputs - 1U) {
      iVar4 = nInputs;
    }
    vOrder->nCap = iVar4;
    if (iVar4 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)iVar4 << 2);
    }
    vOrder->pArray = piVar5;
    vOrder->nSize = nInputs;
    piVar6 = (int *)0x0;
    memset(piVar5,0,(long)nInputs << 2);
    vVisit = (Vec_Int_t *)malloc(0x10);
    vVisit->nCap = uVar12;
    if (uVar12 != 0) {
      piVar6 = (int *)malloc(uVar8 << 2);
    }
    vVisit->pArray = piVar6;
    vVisit->nSize = uVar1;
    memset(piVar6,0,__n);
    if (0 < nInputs) {
      uVar12 = 0xffffffff;
      if (-1 < (int)uVar9) {
        uVar12 = uVar9;
      }
      uVar8 = 0;
      do {
        if (uVar12 + 1 == uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar6[uVar8] = 1;
        uVar8 = uVar8 + 1;
      } while ((uint)nInputs != uVar8);
    }
    if (nInputs <= (int)uVar9) {
      piVar5 = piVar6 + (uint)nInputs;
      iVar4 = nInputs;
      do {
        if (nInputs < 0) {
LAB_006b3e26:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*piVar5 == 0) {
          Gia_ManFxTopoOrder_rec(vCubes,vFirst,vCount,vVisit,vOrder,iVar4);
        }
        piVar5 = piVar5 + 1;
        bVar3 = iVar4 < (int)uVar9;
        iVar4 = iVar4 + 1;
      } while (bVar3);
      nInputs = vOrder->nSize;
    }
    if (nInputs != uVar1) {
      __assert_fail("Vec_IntSize(vOrder) == nNodeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                    ,0x133,
                    "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                   );
    }
    if (piVar6 != (int *)0x0) {
      free(piVar6);
    }
    free(vVisit);
    *pvFirst = vFirst;
    *pvCount = vCount;
  }
  return vOrder;
}

Assistant:

Vec_Int_t * Gia_ManFxTopoOrder( Vec_Wec_t * vCubes, int nInputs, int nStart, Vec_Int_t ** pvFirst, Vec_Int_t ** pvCount )
{
    Vec_Int_t * vOrder, * vFirst, * vCount, * vVisit, * vCube;
    int i, iFanin, nNodeMax = -1;
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        nNodeMax = Abc_MaxInt( nNodeMax, Vec_IntEntry(vCube, 0) );
    nNodeMax++;
    // quit if there is no new nodes
    if ( nNodeMax == nStart )
    {
        //printf( "The network is unchanged by fast extract.\n" );
        return NULL;
    }
    // find first cube and how many cubes
    vFirst = Vec_IntStart( nNodeMax );
    vCount = Vec_IntStart( nNodeMax );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        assert( iFanin >= nInputs );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // put all of them in a topo order
    vOrder = Vec_IntStart( nInputs );
    vVisit = Vec_IntStart( nNodeMax );
    for ( i = 0; i < nInputs; i++ )
        Vec_IntWriteEntry( vVisit, i, 1 );
    for ( i = nInputs; i < nNodeMax; i++ )
        if ( !Vec_IntEntry( vVisit, i ) )
            Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, i );
    assert( Vec_IntSize(vOrder) == nNodeMax );
    Vec_IntFree( vVisit );
    // return topological order of new nodes
    *pvFirst = vFirst;
    *pvCount = vCount;
    return vOrder;
}